

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# objectivec_helpers.cc
# Opt level: O2

string * __thiscall
google::protobuf::compiler::objectivec::DefaultValue_abi_cxx11_
          (string *__return_storage_ptr__,objectivec *this,FieldDescriptor *field)

{
  CppType CVar1;
  Type TVar2;
  LogMessage *other;
  EnumValueDescriptor *this_00;
  unsigned_long i;
  EnumValueDescriptor *descriptor;
  char *pcVar3;
  objectivec *this_01;
  string *psVar4;
  string bytes;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  string local_98;
  string local_78;
  string local_58;
  string local_38;
  
  if (*(int *)(this + 0x4c) == 3) {
switchD_0025f7d1_caseD_a:
    pcVar3 = "nil";
    goto LAB_0025f7a3;
  }
  this_01 = this;
  CVar1 = FieldDescriptor::cpp_type((FieldDescriptor *)this);
  switch(CVar1) {
  case CPPTYPE_INT32:
    SimpleItoa_abi_cxx11_(__return_storage_ptr__,(protobuf *)(ulong)*(uint *)(this + 0xa0),(uint)i);
    return __return_storage_ptr__;
  case CPPTYPE_INT64:
    SimpleItoa_abi_cxx11_(&bytes,*(protobuf **)(this + 0xa0),i);
    std::operator+(__return_storage_ptr__,&bytes,"LL");
    break;
  case CPPTYPE_UINT32:
    SimpleItoa_abi_cxx11_(&bytes,(protobuf *)(ulong)*(uint *)(this + 0xa0),(uint)i);
    std::operator+(__return_storage_ptr__,&bytes,"U");
    break;
  case CPPTYPE_UINT64:
    SimpleItoa_abi_cxx11_(&bytes,*(protobuf **)(this + 0xa0),i);
    std::operator+(__return_storage_ptr__,&bytes,"ULL");
    break;
  case CPPTYPE_DOUBLE:
    SimpleDtoa_abi_cxx11_(&local_38,(protobuf *)this_01,*(double *)(this + 0xa0));
    HandleExtremeFloatingPoint(__return_storage_ptr__,&local_38,false);
    psVar4 = &local_38;
    goto LAB_0025fa44;
  case CPPTYPE_FLOAT:
    SimpleFtoa_abi_cxx11_(&local_58,(protobuf *)this_01,*(float *)(this + 0xa0));
    HandleExtremeFloatingPoint(__return_storage_ptr__,&local_58,true);
    psVar4 = &local_58;
    goto LAB_0025fa44;
  case CPPTYPE_BOOL:
    pcVar3 = "NO";
    if (this[0xa0] != (objectivec)0x0) {
      pcVar3 = "YES";
    }
    goto LAB_0025f7a3;
  case CPPTYPE_ENUM:
    this_00 = FieldDescriptor::default_value_enum((FieldDescriptor *)this);
    EnumValueName_abi_cxx11_(__return_storage_ptr__,(objectivec *)this_00,descriptor);
    return __return_storage_ptr__;
  case CPPTYPE_STRING:
    if ((this[0x98] != (objectivec)0x1) ||
       (psVar4 = *(string **)(this + 0xa0), psVar4->_M_string_length == 0))
    goto switchD_0025f7d1_caseD_a;
    TVar2 = FieldDescriptor::type((FieldDescriptor *)this);
    if (TVar2 != TYPE_BYTES) {
      CEscape(&local_98,psVar4);
      EscapeTrigraphs(&local_b8,&local_98);
      std::operator+(&bytes,"@\"",&local_b8);
      std::operator+(__return_storage_ptr__,&bytes,"\"");
      std::__cxx11::string::~string((string *)&bytes);
      std::__cxx11::string::~string((string *)&local_b8);
      psVar4 = &local_98;
      goto LAB_0025fa44;
    }
    bytes.field_2._M_allocated_capacity._0_4_ = ghtonl((uint32)psVar4->_M_string_length);
    bytes._M_dataplus._M_p = (pointer)&bytes.field_2;
    bytes._M_string_length = 4;
    bytes.field_2._M_local_buf[4] = '\0';
    std::__cxx11::string::append((string *)&bytes);
    CEscape(&local_78,&bytes);
    EscapeTrigraphs(&local_98,&local_78);
    std::operator+(&local_b8,"(NSData*)\"",&local_98);
    std::operator+(__return_storage_ptr__,&local_b8,"\"");
    std::__cxx11::string::~string((string *)&local_b8);
    std::__cxx11::string::~string((string *)&local_98);
    std::__cxx11::string::~string((string *)&local_78);
    break;
  case CPPTYPE_MESSAGE:
    goto switchD_0025f7d1_caseD_a;
  default:
    internal::LogMessage::LogMessage
              ((LogMessage *)&bytes,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/compiler/objectivec/objectivec_helpers.cc"
               ,0x327);
    other = internal::LogMessage::operator<<((LogMessage *)&bytes,"Can\'t get here.");
    internal::LogFinisher::operator=((LogFinisher *)&local_b8,other);
    internal::LogMessage::~LogMessage((LogMessage *)&bytes);
    pcVar3 = (char *)0x0;
LAB_0025f7a3:
    std::__cxx11::string::string((string *)__return_storage_ptr__,pcVar3,(allocator *)&bytes);
    return __return_storage_ptr__;
  }
  psVar4 = &bytes;
LAB_0025fa44:
  std::__cxx11::string::~string((string *)psVar4);
  return __return_storage_ptr__;
}

Assistant:

string DefaultValue(const FieldDescriptor* field) {
  // Repeated fields don't have defaults.
  if (field->is_repeated()) {
    return "nil";
  }

  // Switch on cpp_type since we need to know which default_value_* method
  // of FieldDescriptor to call.
  switch (field->cpp_type()) {
    case FieldDescriptor::CPPTYPE_INT32:
      // gcc and llvm reject the decimal form of kint32min and kint64min.
      if (field->default_value_int32() == INT_MIN) {
        return "-0x80000000";
      }
      return SimpleItoa(field->default_value_int32());
    case FieldDescriptor::CPPTYPE_UINT32:
      return SimpleItoa(field->default_value_uint32()) + "U";
    case FieldDescriptor::CPPTYPE_INT64:
      // gcc and llvm reject the decimal form of kint32min and kint64min.
      if (field->default_value_int64() == LLONG_MIN) {
        return "-0x8000000000000000LL";
      }
      return SimpleItoa(field->default_value_int64()) + "LL";
    case FieldDescriptor::CPPTYPE_UINT64:
      return SimpleItoa(field->default_value_uint64()) + "ULL";
    case FieldDescriptor::CPPTYPE_DOUBLE:
      return HandleExtremeFloatingPoint(
          SimpleDtoa(field->default_value_double()), false);
    case FieldDescriptor::CPPTYPE_FLOAT:
      return HandleExtremeFloatingPoint(
          SimpleFtoa(field->default_value_float()), true);
    case FieldDescriptor::CPPTYPE_BOOL:
      return field->default_value_bool() ? "YES" : "NO";
    case FieldDescriptor::CPPTYPE_STRING: {
      const bool has_default_value = field->has_default_value();
      const string& default_string = field->default_value_string();
      if (!has_default_value || default_string.length() == 0) {
        // If the field is defined as being the empty string,
        // then we will just assign to nil, as the empty string is the
        // default for both strings and data.
        return "nil";
      }
      if (field->type() == FieldDescriptor::TYPE_BYTES) {
        // We want constant fields in our data structures so we can
        // declare them as static. To achieve this we cheat and stuff
        // a escaped c string (prefixed with a length) into the data
        // field, and cast it to an (NSData*) so it will compile.
        // The runtime library knows how to handle it.

        // Must convert to a standard byte order for packing length into
        // a cstring.
        uint32 length = ghtonl(default_string.length());
        string bytes((const char*)&length, sizeof(length));
        bytes.append(default_string);
        return "(NSData*)\"" + EscapeTrigraphs(CEscape(bytes)) + "\"";
      } else {
        return "@\"" + EscapeTrigraphs(CEscape(default_string)) + "\"";
      }
    }
    case FieldDescriptor::CPPTYPE_ENUM:
      return EnumValueName(field->default_value_enum());
    case FieldDescriptor::CPPTYPE_MESSAGE:
      return "nil";
  }

  // Some compilers report reaching end of function even though all cases of
  // the enum are handed in the switch.
  GOOGLE_LOG(FATAL) << "Can't get here.";
  return NULL;
}